

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

VmValue * CompileVmBinaryOp(ExpressionContext *ctx,VmModule *module,ExprBinaryOp *node)

{
  int iVar1;
  VmModule *pVVar2;
  SynBase *source;
  VmValue *pVVar3;
  VmBlock *pVVar4;
  VmBlock *block;
  VmBlock *block_00;
  VmConstant *pVVar5;
  VmInstruction *valueA;
  VmInstruction *valueB;
  VmValue *lhs;
  SynBase *source_00;
  TypeBase *expr;
  VmType type;
  VmType type_00;
  VmValue *in_stack_ffffffffffffffb8;
  VmBlock *local_38;
  
  pVVar3 = CompileVm(ctx,module,node->lhs);
  iVar1 = *(int *)&(node->super_ExprBase).field_0x2c;
  if (iVar1 == 0x13) {
    pVVar4 = anon_unknown.dwarf_22bf96::CreateBlock
                       (module,(node->super_ExprBase).source,"lor_check_rhs");
    block = anon_unknown.dwarf_22bf96::CreateBlock
                      (module,(node->super_ExprBase).source,"lor_store_1");
    block_00 = anon_unknown.dwarf_22bf96::CreateBlock
                         (module,(node->super_ExprBase).source,"lor_store_0");
    local_38 = anon_unknown.dwarf_22bf96::CreateBlock
                         (module,(node->super_ExprBase).source,"lor_exit");
    anon_unknown.dwarf_22bf96::CreateJumpNotZero
              (module,(node->super_ExprBase).source,pVVar3,&block->super_VmValue,
               &pVVar4->super_VmValue);
    VmFunction::AddBlock(module->currentFunction,pVVar4);
    module->currentBlock = pVVar4;
    pVVar3 = CompileVm(ctx,module,node->rhs);
    anon_unknown.dwarf_22bf96::CreateJumpNotZero
              (module,(node->super_ExprBase).source,pVVar3,&block->super_VmValue,
               &block_00->super_VmValue);
LAB_00273eb8:
    VmFunction::AddBlock(module->currentFunction,block);
    module->currentBlock = block;
    pVVar2 = (VmModule *)(node->super_ExprBase).source;
    pVVar5 = CreateConstantInt(module->allocator,(SynBase *)pVVar2,1);
    type.structType = (TypeBase *)0x7;
    type._0_8_ = (pVVar5->super_VmValue).type.structType;
    valueA = anon_unknown.dwarf_22bf96::CreateInstruction
                       ((anon_unknown_dwarf_22bf96 *)module,pVVar2,
                        *(SynBase **)&(pVVar5->super_VmValue).type,type,(VmInstructionType)pVVar5,
                        (VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,
                        in_stack_ffffffffffffffb8);
    anon_unknown.dwarf_22bf96::CreateJump
              (module,(node->super_ExprBase).source,&local_38->super_VmValue);
    VmFunction::AddBlock(module->currentFunction,block_00);
    module->currentBlock = block_00;
    pVVar2 = (VmModule *)(node->super_ExprBase).source;
    pVVar5 = CreateConstantInt(module->allocator,(SynBase *)pVVar2,0);
    type_00.structType = (TypeBase *)0x7;
    type_00._0_8_ = (pVVar5->super_VmValue).type.structType;
    valueB = anon_unknown.dwarf_22bf96::CreateInstruction
                       ((anon_unknown_dwarf_22bf96 *)module,pVVar2,
                        *(SynBase **)&(pVVar5->super_VmValue).type,type_00,(VmInstructionType)pVVar5
                        ,(VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,
                        in_stack_ffffffffffffffb8);
    anon_unknown.dwarf_22bf96::CreateJump
              (module,(node->super_ExprBase).source,&local_38->super_VmValue);
    VmFunction::AddBlock(module->currentFunction,local_38);
    module->currentBlock = local_38;
    if ((valueA == (VmInstruction *)0x0) || ((valueA->super_VmValue).typeID != 2)) {
      valueA = (VmInstruction *)0x0;
    }
    if ((valueB == (VmInstruction *)0x0) || ((valueB->super_VmValue).typeID != 2)) {
      valueB = (VmInstruction *)0x0;
    }
    pVVar3 = anon_unknown.dwarf_22bf96::CreatePhi
                       (module,(node->super_ExprBase).source,valueA,valueB);
    expr = (node->super_ExprBase).type;
    goto LAB_002741f9;
  }
  if (iVar1 == 0x12) {
    pVVar4 = anon_unknown.dwarf_22bf96::CreateBlock
                       (module,(node->super_ExprBase).source,"land_check_rhs");
    block = anon_unknown.dwarf_22bf96::CreateBlock
                      (module,(node->super_ExprBase).source,"land_store_1");
    block_00 = anon_unknown.dwarf_22bf96::CreateBlock
                         (module,(node->super_ExprBase).source,"land_store_0");
    local_38 = anon_unknown.dwarf_22bf96::CreateBlock
                         (module,(node->super_ExprBase).source,"land_exit");
    anon_unknown.dwarf_22bf96::CreateJumpZero
              (module,(node->super_ExprBase).source,pVVar3,&block_00->super_VmValue,
               &pVVar4->super_VmValue);
    VmFunction::AddBlock(module->currentFunction,pVVar4);
    module->currentBlock = pVVar4;
    pVVar3 = CompileVm(ctx,module,node->rhs);
    anon_unknown.dwarf_22bf96::CreateJumpZero
              (module,(node->super_ExprBase).source,pVVar3,&block_00->super_VmValue,
               &block->super_VmValue);
    goto LAB_00273eb8;
  }
  lhs = CompileVm(ctx,module,node->rhs);
  switch(*(undefined4 *)&(node->super_ExprBase).field_0x2c) {
  case 1:
    pVVar3 = anon_unknown.dwarf_22bf96::CreateAdd(module,(node->super_ExprBase).source,pVVar3,lhs);
    break;
  case 2:
    pVVar3 = anon_unknown.dwarf_22bf96::CreateSub(module,(node->super_ExprBase).source,pVVar3,lhs);
    break;
  case 3:
    pVVar3 = anon_unknown.dwarf_22bf96::CreateMul(module,(node->super_ExprBase).source,pVVar3,lhs);
    break;
  case 4:
    pVVar3 = anon_unknown.dwarf_22bf96::CreateDiv(module,(node->super_ExprBase).source,pVVar3,lhs);
    break;
  case 5:
    pVVar3 = anon_unknown.dwarf_22bf96::CreateMod(module,(node->super_ExprBase).source,pVVar3,lhs);
    break;
  case 6:
    pVVar3 = anon_unknown.dwarf_22bf96::CreatePow(module,(node->super_ExprBase).source,pVVar3,lhs);
    break;
  case 7:
    pVVar3 = anon_unknown.dwarf_22bf96::CreateShl(module,(node->super_ExprBase).source,pVVar3,lhs);
    break;
  case 8:
    pVVar3 = anon_unknown.dwarf_22bf96::CreateShr(module,(node->super_ExprBase).source,pVVar3,lhs);
    break;
  case 9:
    pVVar3 = anon_unknown.dwarf_22bf96::CreateCompareLess
                       (module,(node->super_ExprBase).source,pVVar3,lhs);
    break;
  case 10:
    pVVar3 = anon_unknown.dwarf_22bf96::CreateCompareLessEqual
                       (module,(node->super_ExprBase).source,pVVar3,lhs);
    break;
  case 0xb:
    pVVar3 = anon_unknown.dwarf_22bf96::CreateCompareGreater
                       (module,(node->super_ExprBase).source,pVVar3,lhs);
    break;
  case 0xc:
    pVVar3 = anon_unknown.dwarf_22bf96::CreateCompareGreaterEqual
                       (module,(node->super_ExprBase).source,pVVar3,lhs);
    break;
  case 0xd:
    pVVar3 = anon_unknown.dwarf_22bf96::CreateCompareEqual
                       (module,(node->super_ExprBase).source,pVVar3,lhs);
    break;
  case 0xe:
    source_00 = (node->super_ExprBase).source;
    goto LAB_0027410e;
  case 0xf:
    pVVar3 = anon_unknown.dwarf_22bf96::CreateAnd(module,(node->super_ExprBase).source,pVVar3,lhs);
    break;
  case 0x10:
    pVVar3 = anon_unknown.dwarf_22bf96::CreateOr(module,(node->super_ExprBase).source,pVVar3,lhs);
    break;
  case 0x11:
    pVVar3 = anon_unknown.dwarf_22bf96::CreateXor(module,(node->super_ExprBase).source,pVVar3,lhs);
    break;
  default:
    goto switchD_00274000_caseD_12;
  case 0x14:
    source_00 = (node->super_ExprBase).source;
    pVVar5 = CreateConstantZero(module->allocator,source_00,pVVar3->type);
    pVVar3 = anon_unknown.dwarf_22bf96::CreateCompareNotEqual
                       (module,source_00,pVVar3,&pVVar5->super_VmValue);
    source = (node->super_ExprBase).source;
    pVVar5 = CreateConstantZero(module->allocator,source,lhs->type);
    lhs = anon_unknown.dwarf_22bf96::CreateCompareNotEqual(module,source,lhs,&pVVar5->super_VmValue)
    ;
LAB_0027410e:
    pVVar3 = anon_unknown.dwarf_22bf96::CreateCompareNotEqual(module,source_00,pVVar3,lhs);
  }
  if (pVVar3 == (VmValue *)0x0) {
switchD_00274000_caseD_12:
    __assert_fail("result",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0xbcc,
                  "VmValue *CompileVmBinaryOp(ExpressionContext &, VmModule *, ExprBinaryOp *)");
  }
  expr = (node->super_ExprBase).type;
LAB_002741f9:
  anon_unknown.dwarf_22bf96::CheckType(ctx,(ExprBase *)expr,pVVar3);
  return pVVar3;
}

Assistant:

VmValue* CompileVmBinaryOp(ExpressionContext &ctx, VmModule *module, ExprBinaryOp *node)
{
	VmValue *lhs = CompileVm(ctx, module, node->lhs);

	if(node->op == SYN_BINARY_OP_LOGICAL_AND)
	{
		VmBlock *checkRhsBlock = CreateBlock(module, node->source, "land_check_rhs");
		VmBlock *storeOneBlock = CreateBlock(module, node->source, "land_store_1");
		VmBlock *storeZeroBlock = CreateBlock(module, node->source, "land_store_0");
		VmBlock *exitBlock = CreateBlock(module, node->source, "land_exit");

		CreateJumpZero(module, node->source, lhs, storeZeroBlock, checkRhsBlock);

		module->currentFunction->AddBlock(checkRhsBlock);
		module->currentBlock = checkRhsBlock;

		VmValue *rhs = CompileVm(ctx, module, node->rhs);

		CreateJumpZero(module, node->source, rhs, storeZeroBlock, storeOneBlock);

		module->currentFunction->AddBlock(storeOneBlock);
		module->currentBlock = storeOneBlock;

		VmValue *trueValue = CreateLoadImmediate(module, node->source, CreateConstantInt(module->allocator, node->source, 1));

		CreateJump(module, node->source, exitBlock);

		module->currentFunction->AddBlock(storeZeroBlock);
		module->currentBlock = storeZeroBlock;

		VmValue *falseValue = CreateLoadImmediate(module, node->source, CreateConstantInt(module->allocator, node->source, 0));

		CreateJump(module, node->source, exitBlock);

		module->currentFunction->AddBlock(exitBlock);
		module->currentBlock = exitBlock;

		VmValue *phi = CreatePhi(module, node->source, getType<VmInstruction>(trueValue), getType<VmInstruction>(falseValue));

		return CheckType(ctx, node, phi);
	}

	if(node->op == SYN_BINARY_OP_LOGICAL_OR)
	{
		VmBlock *checkRhsBlock = CreateBlock(module, node->source, "lor_check_rhs");
		VmBlock *storeOneBlock = CreateBlock(module, node->source, "lor_store_1");
		VmBlock *storeZeroBlock = CreateBlock(module, node->source, "lor_store_0");
		VmBlock *exitBlock = CreateBlock(module, node->source, "lor_exit");

		CreateJumpNotZero(module, node->source, lhs, storeOneBlock, checkRhsBlock);

		module->currentFunction->AddBlock(checkRhsBlock);
		module->currentBlock = checkRhsBlock;

		VmValue *rhs = CompileVm(ctx, module, node->rhs);

		CreateJumpNotZero(module, node->source, rhs, storeOneBlock, storeZeroBlock);

		module->currentFunction->AddBlock(storeOneBlock);
		module->currentBlock = storeOneBlock;

		VmValue *trueValue = CreateLoadImmediate(module, node->source, CreateConstantInt(module->allocator, node->source, 1));

		CreateJump(module, node->source, exitBlock);

		module->currentFunction->AddBlock(storeZeroBlock);
		module->currentBlock = storeZeroBlock;

		VmValue *falseValue = CreateLoadImmediate(module, node->source, CreateConstantInt(module->allocator, node->source, 0));

		CreateJump(module, node->source, exitBlock);

		module->currentFunction->AddBlock(exitBlock);
		module->currentBlock = exitBlock;

		VmValue *phi = CreatePhi(module, node->source, getType<VmInstruction>(trueValue), getType<VmInstruction>(falseValue));

		return CheckType(ctx, node, phi);
	}

	VmValue *rhs = CompileVm(ctx, module, node->rhs);

	VmValue *result = NULL;

	switch(node->op)
	{
	case SYN_BINARY_OP_ADD:
		result = CreateAdd(module, node->source, lhs, rhs);
		break;
	case SYN_BINARY_OP_SUB:
		result = CreateSub(module, node->source, lhs, rhs);
		break;
	case SYN_BINARY_OP_MUL:
		result = CreateMul(module, node->source, lhs, rhs);
		break;
	case SYN_BINARY_OP_DIV:
		result = CreateDiv(module, node->source, lhs, rhs);
		break;
	case SYN_BINARY_OP_MOD:
		result = CreateMod(module, node->source, lhs, rhs);
		break;
	case SYN_BINARY_OP_POW:
		result = CreatePow(module, node->source, lhs, rhs);
		break;
	case SYN_BINARY_OP_SHL:
		result = CreateShl(module, node->source, lhs, rhs);
		break;
	case SYN_BINARY_OP_SHR:
		result = CreateShr(module, node->source, lhs, rhs);
		break;
	case SYN_BINARY_OP_LESS:
		result = CreateCompareLess(module, node->source, lhs, rhs);
		break;
	case SYN_BINARY_OP_LESS_EQUAL:
		result = CreateCompareLessEqual(module, node->source, lhs, rhs);
		break;
	case SYN_BINARY_OP_GREATER:
		result = CreateCompareGreater(module, node->source, lhs, rhs);
		break;
	case SYN_BINARY_OP_GREATER_EQUAL:
		result = CreateCompareGreaterEqual(module, node->source, lhs, rhs);
		break;
	case SYN_BINARY_OP_EQUAL:
		result = CreateCompareEqual(module, node->source, lhs, rhs);
		break;
	case SYN_BINARY_OP_NOT_EQUAL:
		result = CreateCompareNotEqual(module, node->source, lhs, rhs);
		break;
	case SYN_BINARY_OP_BIT_AND:
		result = CreateAnd(module, node->source, lhs, rhs);
		break;
	case SYN_BINARY_OP_BIT_OR:
		result = CreateOr(module, node->source, lhs, rhs);
		break;
	case SYN_BINARY_OP_BIT_XOR:
		result = CreateXor(module, node->source, lhs, rhs);
		break;
	case SYN_BINARY_OP_LOGICAL_XOR:
		result = CreateCompareNotEqual(module, node->source, CreateCompareNotEqual(module, node->source, lhs, CreateConstantZero(module->allocator, node->source, lhs->type)), CreateCompareNotEqual(module, node->source, rhs, CreateConstantZero(module->allocator, node->source, rhs->type)));
		break;
	default:
		break;
	}

	assert(result);

	return CheckType(ctx, node, result);
}